

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O1

mk_plugin * mk_plugin_load(int type,char *shortname,void *data,mk_server *server)

{
  uint uVar1;
  mk_plugin_stage *pmVar2;
  mk_list *pmVar3;
  int iVar4;
  void *pvVar5;
  mk_plugin *pmVar6;
  long lVar7;
  undefined8 *puVar8;
  mk_plugin *pmVar9;
  char *pcVar10;
  undefined4 in_register_0000003c;
  mk_list *pmVar11;
  char symbol [64];
  char local_78 [72];
  
  pvVar5 = (void *)CONCAT44(in_register_0000003c,type);
  if (type == 1) {
    pvVar5 = mk_plugin_load_dynamic((char *)data);
    if (pvVar5 == (void *)0x0) {
      return (mk_plugin *)0x0;
    }
    snprintf(local_78,0x3f,"mk_plugin_%s",shortname);
    dlerror();
    pmVar6 = (mk_plugin *)dlsym(pvVar5,local_78);
    lVar7 = dlerror();
    pmVar9 = (mk_plugin *)0x0;
    if (lVar7 == 0) {
      pmVar9 = pmVar6;
    }
    if (pmVar9 == (mk_plugin *)0x0) {
      pcVar10 = "Plugin \'%s\' is not registering properly";
LAB_0010f2ec:
      mk_print(0x1002,pcVar10,data);
      dlclose(pvVar5);
      return (mk_plugin *)0x0;
    }
    for (pmVar11 = (server->plugins).next; pmVar11 != &server->plugins; pmVar11 = pmVar11->next) {
      if ((*(int *)&pmVar11[2].prev == 0) &&
         (iVar4 = strcmp((char *)pmVar11[-7].next,pmVar9->name), iVar4 == 0)) {
        data = pmVar11[-7].prev;
        pcVar10 = "Plugin \'%s\' have been built-in.";
        goto LAB_0010f2ec;
      }
    }
    pmVar9->load_type = 1;
    pmVar9->handler = pvVar5;
    pvVar5 = data;
    pcVar10 = mk_string_dup((char *)data);
    pmVar9->path = pcVar10;
    data = pmVar9;
  }
  else if (type == 0) {
    *(undefined4 *)((long)data + 0x98) = 0;
  }
  else {
    data = (mk_plugin *)0x0;
  }
  if ((mk_plugin *)data == (mk_plugin *)0x0) {
    return (mk_plugin *)0x0;
  }
  if ((((((mk_plugin *)data)->shortname == (char *)0x0) ||
       (((mk_plugin *)data)->name == (char *)0x0)) || (((mk_plugin *)data)->version == (char *)0x0))
     || ((((mk_plugin *)data)->init_plugin == (_func_int_mk_plugin_ptr_char_ptr *)0x0 ||
         (((mk_plugin *)data)->exit_plugin == (_func_int_mk_plugin_ptr *)0x0)))) {
    mk_print(0x1002,"Plugin \'%s\' is not registering all fields properly",shortname);
    return (mk_plugin *)0x0;
  }
  uVar1 = ((mk_plugin *)data)->hooks;
  if (((char)uVar1 < '\0') && (((mk_plugin *)data)->network == (mk_plugin_network *)0x0)) {
    mk_plugin_load_cold_1();
    pmVar9 = (mk_plugin *)malloc((size_t)pvVar5);
    if (pvVar5 == (void *)0x0 || pmVar9 != (mk_plugin *)0x0) {
      return pmVar9;
    }
    perror("malloc");
  }
  pmVar11 = &((mk_plugin *)data)->stage_list;
  (((mk_plugin *)data)->stage_list).next = pmVar11;
  (((mk_plugin *)data)->stage_list).prev = pmVar11;
  if ((uVar1 >> 8 & 1) != 0) {
    pmVar2 = ((mk_plugin *)data)->stage;
    if (pmVar2->stage10 != (_func_int_int *)0x0) {
      puVar8 = (undefined8 *)mk_mem_alloc(0x60);
      *puVar8 = pmVar2->stage10;
      puVar8[7] = data;
      pmVar3 = (server->stage10_handler).prev;
      (server->stage10_handler).prev = (mk_list *)(puVar8 + 8);
      puVar8[9] = &server->stage10_handler;
      puVar8[8] = pmVar3;
      pmVar3->next = (mk_list *)(puVar8 + 8);
      pmVar3 = (((mk_plugin *)data)->stage_list).prev;
      (((mk_plugin *)data)->stage_list).prev = (mk_list *)(puVar8 + 10);
      puVar8[0xb] = pmVar11;
      puVar8[10] = pmVar3;
      pmVar3->next = (mk_list *)(puVar8 + 10);
    }
    if (pmVar2->stage20 != (_func_int_mk_http_session_ptr_mk_http_request_ptr *)0x0) {
      pvVar5 = mk_mem_alloc(0x60);
      *(_func_int_mk_http_session_ptr_mk_http_request_ptr **)((long)pvVar5 + 8) = pmVar2->stage20;
      *(void **)((long)pvVar5 + 0x38) = data;
      pmVar3 = (server->stage20_handler).prev;
      (server->stage20_handler).prev = (mk_list *)((long)pvVar5 + 0x40);
      *(mk_list **)((long)pvVar5 + 0x48) = &server->stage20_handler;
      *(mk_list **)((long)pvVar5 + 0x40) = pmVar3;
      pmVar3->next = (mk_list *)((long)pvVar5 + 0x40);
      pmVar3 = (((mk_plugin *)data)->stage_list).prev;
      (((mk_plugin *)data)->stage_list).prev = (mk_list *)((long)pvVar5 + 0x50);
      *(mk_list **)((long)pvVar5 + 0x58) = pmVar11;
      *(mk_list **)((long)pvVar5 + 0x50) = pmVar3;
      pmVar3->next = (mk_list *)((long)pvVar5 + 0x50);
    }
    if (pmVar2->stage30 !=
        (_func_int_mk_plugin_ptr_mk_http_session_ptr_mk_http_request_ptr_int_mk_list_ptr *)0x0) {
      pvVar5 = mk_mem_alloc(0x60);
      *(_func_int_mk_plugin_ptr_mk_http_session_ptr_mk_http_request_ptr_int_mk_list_ptr **)
       ((long)pvVar5 + 0x10) = pmVar2->stage30;
      *(void **)((long)pvVar5 + 0x38) = data;
      pmVar3 = (server->stage30_handler).prev;
      (server->stage30_handler).prev = (mk_list *)((long)pvVar5 + 0x40);
      *(mk_list **)((long)pvVar5 + 0x48) = &server->stage30_handler;
      *(mk_list **)((long)pvVar5 + 0x40) = pmVar3;
      pmVar3->next = (mk_list *)((long)pvVar5 + 0x40);
      pmVar3 = (((mk_plugin *)data)->stage_list).prev;
      (((mk_plugin *)data)->stage_list).prev = (mk_list *)((long)pvVar5 + 0x50);
      *(mk_list **)((long)pvVar5 + 0x58) = pmVar11;
      *(mk_list **)((long)pvVar5 + 0x50) = pmVar3;
      pmVar3->next = (mk_list *)((long)pvVar5 + 0x50);
    }
    if (pmVar2->stage40 != (_func_int_mk_http_session_ptr_mk_http_request_ptr *)0x0) {
      pvVar5 = mk_mem_alloc(0x60);
      *(_func_int_mk_http_session_ptr_mk_http_request_ptr **)((long)pvVar5 + 0x28) = pmVar2->stage40
      ;
      *(void **)((long)pvVar5 + 0x38) = data;
      pmVar3 = (server->stage40_handler).prev;
      (server->stage40_handler).prev = (mk_list *)((long)pvVar5 + 0x40);
      *(mk_list **)((long)pvVar5 + 0x48) = &server->stage40_handler;
      *(mk_list **)((long)pvVar5 + 0x40) = pmVar3;
      pmVar3->next = (mk_list *)((long)pvVar5 + 0x40);
      pmVar3 = (((mk_plugin *)data)->stage_list).prev;
      (((mk_plugin *)data)->stage_list).prev = (mk_list *)((long)pvVar5 + 0x50);
      *(mk_list **)((long)pvVar5 + 0x58) = pmVar11;
      *(mk_list **)((long)pvVar5 + 0x50) = pmVar3;
      pmVar3->next = (mk_list *)((long)pvVar5 + 0x50);
    }
    if (pmVar2->stage50 != (_func_int_int *)0x0) {
      pvVar5 = mk_mem_alloc(0x60);
      *(_func_int_int **)((long)pvVar5 + 0x30) = pmVar2->stage50;
      *(void **)((long)pvVar5 + 0x38) = data;
      pmVar3 = (server->stage50_handler).prev;
      (server->stage50_handler).prev = (mk_list *)((long)pvVar5 + 0x40);
      *(mk_list **)((long)pvVar5 + 0x48) = &server->stage50_handler;
      *(mk_list **)((long)pvVar5 + 0x40) = pmVar3;
      pmVar3->next = (mk_list *)((long)pvVar5 + 0x40);
      pmVar3 = (((mk_plugin *)data)->stage_list).prev;
      (((mk_plugin *)data)->stage_list).prev = (mk_list *)((long)pvVar5 + 0x50);
      *(mk_list **)((long)pvVar5 + 0x58) = pmVar11;
      *(mk_list **)((long)pvVar5 + 0x50) = pmVar3;
      pmVar3->next = (mk_list *)((long)pvVar5 + 0x50);
    }
  }
  if (type == 1) {
    pmVar11 = (server->plugins).prev;
    (server->plugins).prev = &((mk_plugin *)data)->_head;
    (((mk_plugin *)data)->_head).next = &server->plugins;
    (((mk_plugin *)data)->_head).prev = pmVar11;
    pmVar11->next = &((mk_plugin *)data)->_head;
    return (mk_plugin *)data;
  }
  return (mk_plugin *)data;
}

Assistant:

struct mk_plugin *mk_plugin_load(int type, const char *shortname,
                                 void *data, struct mk_server *server)
{
    char *path;
    char symbol[64];
    void *handler;
    struct mk_list *head;
    struct mk_plugin *tmp;
    struct mk_plugin *plugin = NULL;
    struct mk_plugin_stage *stage;

    /* Set main struct name to reference */
    if (type == MK_PLUGIN_DYNAMIC) {
        path = (char *) data;
        handler = mk_plugin_load_dynamic(path);
        if (!handler) {
            return NULL;
        }

        snprintf(symbol, sizeof(symbol) - 1, "mk_plugin_%s", shortname);
        plugin  = mk_plugin_load_symbol(handler, symbol);
        if (!plugin) {
            mk_warn("Plugin '%s' is not registering properly", path);
#ifdef _WIN32
            FreeLibrary((HMODULE)handler);
#else
            dlclose(handler);
#endif
            return NULL;
        }

        /* Make sure this is not loaded twice (ref #218) */
        mk_list_foreach(head, &server->plugins) {
            tmp = mk_list_entry(head, struct mk_plugin, _head);
            if (tmp->load_type == MK_PLUGIN_STATIC &&
                strcmp(tmp->name, plugin->name) == 0){
                mk_warn("Plugin '%s' have been built-in.",
                        tmp->shortname);
#ifdef _WIN32
                FreeLibrary((HMODULE)handler);
#else
                dlclose(handler);
#endif
                return NULL;
            }
        }

        plugin->load_type = MK_PLUGIN_DYNAMIC;
        plugin->handler   = handler;
        plugin->path      = mk_string_dup(path);
    }
    else if (type == MK_PLUGIN_STATIC) {
        plugin = (struct mk_plugin *) data;
        plugin->load_type = MK_PLUGIN_STATIC;
    }

    if (!plugin) {
        return NULL;
    }

    /* Validate all callbacks are set */
    if (!plugin->shortname || !plugin->name || !plugin->version ||
        !plugin->init_plugin || !plugin->exit_plugin) {
        mk_warn("Plugin '%s' is not registering all fields properly",
                shortname);
        return NULL;
    }

    if (plugin->hooks & MK_PLUGIN_NETWORK_LAYER) {
        mk_bug(!plugin->network);
    }

    mk_list_init(&plugin->stage_list);
    if (plugin->hooks & MK_PLUGIN_STAGE) {
        struct mk_plugin_stage *st;

        stage = plugin->stage;
        if (stage->stage10) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage10 = stage->stage10;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage10_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage20) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage20 = stage->stage20;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage20_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage30) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage30 = stage->stage30;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage30_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage40) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage40 = stage->stage40;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage40_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage50) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage50 = stage->stage50;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage50_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
    }

    if (type == MK_PLUGIN_DYNAMIC) {
        /* Add Plugin to the end of the list */
        mk_list_add(&plugin->_head, &server->plugins);
    }

    return plugin;
}